

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwShowWindow(GLFWwindow *handle)

{
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/glfw/src/window.c"
                  ,0x284,"void glfwShowWindow(GLFWwindow *)");
  }
  if (_glfwInitialized != 0) {
    if (*(long *)(handle + 0x40) != 0) {
      return;
    }
    _glfwPlatformShowWindow((_GLFWwindow *)handle);
    _glfwPlatformFocusWindow((_GLFWwindow *)handle);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwShowWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformShowWindow(window);
    _glfwPlatformFocusWindow(window);
}